

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessSamplersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Samplers::DefaultsTest::testSamplerFloatParameter
          (DefaultsTest *this,GLenum pname,GLfloat expected_value)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  float fVar4;
  char *local_1c8 [3];
  MessageBuilder local_1b0;
  float local_2c;
  long lStack_28;
  GLfloat value;
  Functions *gl;
  GLfloat expected_value_local;
  GLenum pname_local;
  DefaultsTest *this_local;
  
  gl._0_4_ = expected_value;
  gl._4_4_ = pname;
  _expected_value_local = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_28 = CONCAT44(extraout_var,iVar1);
  local_2c = -1.0;
  (**(code **)(lStack_28 + 0xa48))(this->m_sampler_dsa,gl._4_4_,&local_2c);
  err = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(err,"glGetSamplerParameteriv have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessSamplersTests.cpp"
                  ,0x130);
  fVar4 = de::abs<float>(gl._0_4_ - local_2c);
  if (fVar4 > 0.015625) {
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1b0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1b0,(char (*) [40])"glGetSamplerParameterfv with parameter ");
    local_1c8[0] = glu::getTextureParameterName(gl._4_4_);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1c8);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [15])0x2a74301);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_2c);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [11])0x2a7006b);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(float *)&gl);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [15])0x2a6e9eb);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  }
  return fVar4 <= 0.015625;
}

Assistant:

bool DefaultsTest::testSamplerFloatParameter(glw::GLenum pname, glw::GLfloat expected_value)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get data. */
	glw::GLfloat value = -1.0;

	gl.getSamplerParameterfv(m_sampler_dsa, pname, &value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetSamplerParameteriv have failed");

	if (de::abs(expected_value - value) > 0.015625f /* Precision */)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "glGetSamplerParameterfv with parameter "
											<< glu::getTextureParameterName(pname) << " has returned " << value
											<< ", however " << expected_value << " was expected."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}